

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall
QPlainTextDocumentLayout::layoutBlock(QPlainTextDocumentLayout *this,QTextBlock *block)

{
  double dVar1;
  long lVar2;
  QTextDocumentPrivate *pQVar3;
  double dVar4;
  qreal qVar5;
  char cVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  QTextOption *pQVar12;
  qreal extraout_RDX;
  qreal extraout_RDX_00;
  QTextBlock *this_00;
  long in_FS_OFFSET;
  ulong uVar13;
  double dVar14;
  undefined4 uVar15;
  double dVar16;
  undefined1 *extraout_XMM1_Qa;
  QTextOption option;
  QFontMetrics fm;
  double local_d0;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 *local_70;
  QTextDocumentPrivate *local_68;
  undefined4 local_60;
  QTextDocumentPrivate *local_58;
  double local_50;
  undefined1 local_48 [8];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  QAbstractTextDocumentLayout::document();
  pQVar3 = (QTextDocumentPrivate *)QTextDocument::documentMargin();
  pQVar12 = (QTextOption *)QTextBlock::layout();
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = 0xffffffffffffffff;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultTextOption();
  QTextLayout::setTextOption(pQVar12);
  dVar4 = 0.0;
  if (((ulong)local_80 & 0x400000000) != 0) {
    local_68 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::charFormat();
    QTextCharFormat::font();
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_68,(QFont *)local_48);
    QFont::~QFont((QFont *)local_48);
    QTextFormat::~QTextFormat((QTextFormat *)&local_58);
    iVar7 = QFontMetrics::horizontalAdvance((QChar)(char16_t)(QFontMetrics *)&local_68);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_68);
    dVar4 = (double)iVar7;
  }
  QTextLayout::beginLayout();
  dVar1 = *(double *)(lVar2 + 0x98);
  local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  uVar8 = QTextLayout::createLine();
  local_48._0_4_ = uVar8;
  if (extraout_RDX == 0.0) {
    uVar8 = 0;
    uVar15 = 0;
  }
  else {
    uVar13 = -(ulong)(0.0 < dVar1);
    local_d0 = 0.0;
    dVar16 = 0.0;
    puStack_40 = (undefined1 *)extraout_RDX;
    do {
      QTextLine::setLeadingIncluded(SUB81((QPointF *)local_48,0));
      QTextLine::setLineWidth
                ((double)(~uVar13 & 0x41dfffffffc00000 | (ulong)dVar1 & uVar13) -
                 (dVar4 + (double)pQVar3 + (double)pQVar3));
      local_58 = pQVar3;
      local_50 = local_d0;
      QTextLine::setPosition((QPointF *)local_48);
      dVar14 = (double)QTextLine::height();
      local_d0 = dVar14 + local_d0;
      dVar14 = (double)QTextLine::leading();
      if (dVar14 < 0.0) {
        dVar14 = (double)QTextLine::leading();
        dVar14 = ceil(dVar14);
        local_d0 = local_d0 + (double)(int)dVar14;
      }
      dVar14 = (double)QTextLine::naturalTextWidth();
      dVar14 = dVar14 + (double)pQVar3 + (double)pQVar3;
      if (dVar14 <= dVar16) {
        dVar14 = dVar16;
      }
      local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      uVar9 = QTextLayout::createLine();
      uVar8 = SUB84(dVar14,0);
      uVar15 = (undefined4)((ulong)dVar14 >> 0x20);
      local_48._0_4_ = uVar9;
      dVar16 = dVar14;
      puStack_40 = (undefined1 *)extraout_RDX_00;
    } while (extraout_RDX_00 != 0.0);
  }
  puStack_40 = (undefined1 *)0x0;
  dVar4 = (double)CONCAT44(uVar15,uVar8);
  QTextLayout::endLayout();
  iVar7 = QTextDocument::lineCount();
  cVar6 = QTextBlock::isVisible();
  if (cVar6 != '\0') {
    QTextLayout::lineCount();
  }
  QTextBlock::setLineCount((int)block);
  iVar10 = QTextDocument::lineCount();
  if (dVar4 < *(double *)(lVar2 + 0xa0) || dVar4 == *(double *)(lVar2 + 0xa0)) {
    iVar11 = QTextBlock::blockNumber();
    if ((iVar11 == *(int *)(lVar2 + 0xa8)) && (dVar4 < *(double *)(lVar2 + 0xa0))) {
      this_00 = (QTextBlock *)local_48;
      local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QTextDocument::firstBlock();
      *(undefined8 *)(lVar2 + 0xa0) = 0;
      local_58 = (QTextDocumentPrivate *)0x0;
      local_50 = -3.720660661677042e-103;
      cVar6 = QTextBlock::isValid();
      if (cVar6 != '\0') {
        do {
          qVar5 = blockWidth((QPlainTextDocumentLayout *)this_00,(QTextBlock *)local_48);
          if (*(double *)(lVar2 + 0xa0) <= qVar5 && qVar5 != *(double *)(lVar2 + 0xa0)) {
            *(qreal *)(lVar2 + 0xa0) = qVar5;
            local_58 = (QTextDocumentPrivate *)local_48;
            local_50 = (double)CONCAT44(local_50._4_4_,(int)puStack_40);
          }
          QTextBlock::next();
          local_48 = (undefined1  [8])local_68;
          puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,local_60);
          this_00 = (QTextBlock *)local_48;
          cVar6 = QTextBlock::isValid();
        } while (cVar6 != '\0');
      }
      cVar6 = QTextBlock::isValid();
      if (cVar6 != '\0') goto LAB_00493d53;
    }
    if (iVar7 == iVar10) goto LAB_00493eb5;
  }
  else {
    *(double *)(lVar2 + 0xa0) = dVar4;
LAB_00493d53:
    uVar8 = QTextBlock::blockNumber();
    *(undefined4 *)(lVar2 + 0xa8) = uVar8;
  }
  if (*(char *)(lVar2 + 0xb9) == '\0') {
    local_48 = (undefined1  [8])(**(code **)(*(long *)this + 0x78))(this);
    puStack_40 = extraout_XMM1_Qa;
    QAbstractTextDocumentLayout::documentSizeChanged((QSizeF *)this);
  }
LAB_00493eb5:
  QTextOption::~QTextOption((QTextOption *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextDocumentLayout::layoutBlock(const QTextBlock &block)
{
    Q_D(QPlainTextDocumentLayout);
    QTextDocument *doc = document();
    qreal margin = doc->documentMargin();
    qreal blockMaximumWidth = 0;

    qreal height = 0;
    QTextLayout *tl = block.layout();
    QTextOption option = doc->defaultTextOption();
    tl->setTextOption(option);

    int extraMargin = 0;
    if (option.flags() & QTextOption::AddSpaceForLineAndParagraphSeparators) {
        QFontMetrics fm(block.charFormat().font());
        extraMargin += fm.horizontalAdvance(QChar(0x21B5));
    }
    tl->beginLayout();
    qreal availableWidth = d->width;
    if (availableWidth <= 0) {
        availableWidth = qreal(INT_MAX); // similar to text edit with pageSize.width == 0
    }
    availableWidth -= 2*margin + extraMargin;
    while (1) {
        QTextLine line = tl->createLine();
        if (!line.isValid())
            break;
        line.setLeadingIncluded(true);
        line.setLineWidth(availableWidth);
        line.setPosition(QPointF(margin, height));
        height += line.height();
        if (line.leading() < 0)
            height += qCeil(line.leading());
        blockMaximumWidth = qMax(blockMaximumWidth, line.naturalTextWidth() + 2*margin);
    }
    tl->endLayout();

    int previousLineCount = doc->lineCount();
    const_cast<QTextBlock&>(block).setLineCount(block.isVisible() ? tl->lineCount() : 0);
    int lineCount = doc->lineCount();

    bool emitDocumentSizeChanged = previousLineCount != lineCount;
    if (blockMaximumWidth > d->maximumWidth) {
        // new longest line
        d->maximumWidth = blockMaximumWidth;
        d->maximumWidthBlockNumber = block.blockNumber();
        emitDocumentSizeChanged = true;
    } else if (block.blockNumber() == d->maximumWidthBlockNumber && blockMaximumWidth < d->maximumWidth) {
        // longest line shrinking
        QTextBlock b = doc->firstBlock();
        d->maximumWidth = 0;
        QTextBlock maximumBlock;
        while (b.isValid()) {
            qreal blockMaximumWidth = blockWidth(b);
            if (blockMaximumWidth > d->maximumWidth) {
                d->maximumWidth = blockMaximumWidth;
                maximumBlock = b;
            }
            b = b.next();
        }
        if (maximumBlock.isValid()) {
            d->maximumWidthBlockNumber = maximumBlock.blockNumber();
            emitDocumentSizeChanged = true;
        }
    }
    if (emitDocumentSizeChanged && !d->blockDocumentSizeChanged)
        emit documentSizeChanged(documentSize());
}